

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<char>::parse(NFA<char> *this,Stream *stream)

{
  bool bVar1;
  undefined1 local_40 [8];
  NFA<char> nfa;
  wchar_t ch;
  Stream *stream_local;
  NFA<char> *this_local;
  
  nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states.
  super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Stream::get(stream);
  while( true ) {
    bVar1 = false;
    if ((nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states.
         super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != L')') &&
       (bVar1 = false,
       nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states.
       super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != L'/')) {
      bVar1 = nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states.
              super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != L'\0';
    }
    if (!bVar1) break;
    NFA((NFA<char> *)local_40);
    parse_selection((NFA<char> *)local_40,stream,
                    nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states.
                    super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    concat(this,(NFA<char> *)local_40);
    ~NFA((NFA<char> *)local_40);
    nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states.
    super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Stream::get(stream);
  }
  return;
}

Assistant:

void parse(Stream& stream)
    {
        for (wchar_t ch = stream.get(); ch != L')' && ch != L'/' && ch != L'\0'; ch = stream.get())
        {
            NFA<TCHAR> nfa;
            nfa.parse_selection(stream, ch);
            concat(nfa);
        }
    }